

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O3

uint8_t __thiscall Cache::getByte(Cache *this,uint32_t addr,uint32_t *cycles)

{
  uint32_t *puVar1;
  uint64_t *puVar2;
  pointer pBVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  pointer pBVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  Cache *pCVar12;
  
  this->referenceCounter = this->referenceCounter + 1;
  (this->statistics).numRead = (this->statistics).numRead + 1;
  uVar5 = getBlockId(this,addr);
  if (uVar5 == 0xffffffff) {
    puVar1 = &(this->statistics).numMiss;
    *puVar1 = *puVar1 + 1;
    puVar2 = &(this->statistics).totalCycles;
    *puVar2 = *puVar2 + (ulong)(this->policy).missLatency;
    loadBlockFromLowerLevel(this,addr,cycles);
    pCVar12 = this;
    uVar5 = addr;
    uVar6 = getBlockId(this,addr);
    bVar8 = (byte)uVar5;
    if (uVar6 == 0xffffffff) {
      getByte();
      uVar11 = (pCVar12->policy).blockSize;
      bVar9 = 0xff;
      if (uVar11 != 0) {
        bVar10 = 0;
        bVar9 = 0;
        if (uVar11 != 1) {
          do {
            bVar9 = bVar10 + 1;
            bVar4 = 3 < uVar11;
            uVar11 = uVar11 >> 1;
            bVar10 = bVar9;
          } while (bVar4);
        }
      }
      return ~(byte)(-1 << (bVar9 & 0x1f)) & bVar8;
    }
    uVar11 = (this->policy).blockSize;
    if (uVar11 == 0) {
      bVar8 = 0xff;
    }
    else {
      bVar8 = 0;
      if (uVar11 != 1) {
        do {
          bVar8 = bVar8 + 1;
          bVar4 = 3 < uVar11;
          uVar11 = uVar11 >> 1;
        } while (bVar4);
      }
    }
    pBVar3 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar7 = pBVar3 + (int)uVar6;
    pBVar3[(int)uVar6].lastReference = this->referenceCounter;
  }
  else {
    uVar11 = (this->policy).blockSize;
    if (uVar11 == 0) {
      bVar8 = 0xff;
    }
    else {
      bVar8 = 0;
      if (uVar11 != 1) {
        do {
          bVar8 = bVar8 + 1;
          bVar4 = 3 < uVar11;
          uVar11 = uVar11 >> 1;
        } while (bVar4);
      }
    }
    puVar1 = &(this->statistics).numHit;
    *puVar1 = *puVar1 + 1;
    uVar6 = this->referenceCounter;
    uVar11 = (this->policy).hitLatency;
    puVar2 = &(this->statistics).totalCycles;
    *puVar2 = *puVar2 + (ulong)uVar11;
    pBVar3 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar7 = pBVar3 + (int)uVar5;
    pBVar3[(int)uVar5].lastReference = uVar6;
    if (cycles != (uint32_t *)0x0) {
      *cycles = uVar11;
    }
  }
  return *(uint8_t *)
          (*(long *)&(pBVar7->data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + (ulong)(~(-1 << (bVar8 & 0x1f)) & addr));
}

Assistant:

uint8_t Cache::getByte(uint32_t addr, uint32_t *cycles) {
  this->referenceCounter++;
  this->statistics.numRead++;

  // If in cache, return directly
  int blockId;
  if ((blockId = this->getBlockId(addr)) != -1) {
    uint32_t offset = this->getOffset(addr);
    this->statistics.numHit++;
    this->statistics.totalCycles += this->policy.hitLatency;
    this->blocks[blockId].lastReference = this->referenceCounter;
    if (cycles) *cycles = this->policy.hitLatency;
    return this->blocks[blockId].data[offset];
  }

  // Else, find the data in memory or other level of cache
  this->statistics.numMiss++;
  this->statistics.totalCycles += this->policy.missLatency;
  this->loadBlockFromLowerLevel(addr, cycles);

  // The block is in top level cache now, return directly
  if ((blockId = this->getBlockId(addr)) != -1) {
    uint32_t offset = this->getOffset(addr);
    this->blocks[blockId].lastReference = this->referenceCounter;
    return this->blocks[blockId].data[offset];
  } else {
    fprintf(stderr, "Error: data not in top level cache!\n");
    exit(-1);
  }
}